

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall
Saturation::SaturationAlgorithm::addInputClause(SaturationAlgorithm *this,Clause *cl)

{
  Sos SVar1;
  Options *pOVar2;
  bool bVar3;
  bool bVar4;
  
  if (this->_symEl != (SymElOutput *)0x0) {
    SymElOutput::onInputClause(this->_symEl,cl);
  }
  pOVar2 = (this->super_MainLoop)._opt;
  SVar1 = (pOVar2->_sos).super_OptionValue<Shell::Options::Sos>.actualValue;
  bVar4 = true;
  if (SVar1 == ALL) {
LAB_00506ce4:
    bVar3 = (undefined1  [48])
            ((undefined1  [48])(cl->super_Unit)._inference & (undefined1  [48])0x1c) ==
            (undefined1  [48])0x0;
  }
  else {
    if (SVar1 == THEORY) {
      bVar4 = (pOVar2->_sosTheoryLimit).super_OptionValue<unsigned_int>.actualValue != 0;
    }
    else if (SVar1 == ON) goto LAB_00506ce4;
    bVar3 = false;
  }
  if ((pOVar2->_sineToAge).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\x01') {
    (cl->super_Unit)._inference._age = (uint)(byte)(cl->super_Unit)._inference.field_0x4;
  }
  if ((bVar3) || (!(bool)(bVar4 | ((cl->super_Unit)._inference.field_0x2 & 2) == 0))) {
    addInputSOSClause(this,cl);
  }
  else {
    addNewClause(this,cl);
  }
  if (this->_instantiation != (Instantiation *)0x0) {
    Inferences::Instantiation::registerClause(this->_instantiation,cl);
  }
  *(int *)(DAT_00a141a0 + 0x10) = *(int *)(DAT_00a141a0 + 0x10) + 1;
  return;
}

Assistant:

void SaturationAlgorithm::addInputClause(Clause* cl)
{
  ASS_LE(toNumber(cl->inputType()),toNumber(UnitInputType::CLAIM)); // larger input types should not appear in proof search

  if (_symEl) {
    _symEl->onInputClause(cl);
  }

  bool sosForAxioms = _opt.sos() == Options::Sos::ON || _opt.sos() == Options::Sos::ALL;
  sosForAxioms = sosForAxioms && cl->inputType() == UnitInputType::AXIOM;

  bool sosForTheory = _opt.sos() == Options::Sos::THEORY && _opt.sosTheoryLimit() == 0;

  if (_opt.sineToAge()) {
    unsigned level = cl->getSineLevel();
    // cout << "Adding " << cl->toString() << " level " << level;
    if (level == UINT_MAX) {
      level = env.maxSineLevel - 1; // as the next available (unused) value
      // cout << " -> " << level;
    }
    // cout << endl;
    cl->setAge(level);
  }

  if (sosForAxioms || (cl->isPureTheoryDescendant() && sosForTheory)) {
    addInputSOSClause(cl);
  }
  else {
    addNewClause(cl);
  }

  if (_instantiation) {
    _instantiation->registerClause(cl);
  }

  env.statistics->initialClauses++;
}